

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::Node::Node
          (Node *this,string *name,Type *type,NodeKind kind,DataPiece *data,bool is_placeholder,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *path,bool suppress_empty_list,bool preserve_proto_field_names,bool use_ints_for_enums,
          FieldScrubCallBack *field_scrub_callback)

{
  this->_vptr_Node = (_func_int **)&PTR__Node_003e3bb8;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  this->type_ = type;
  this->kind_ = kind;
  this->is_any_ = false;
  DataPiece::DataPiece(&this->data_,data);
  (this->children_).
  super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->children_).
  super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children_).
  super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->is_placeholder_ = is_placeholder;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->path_,path);
  this->suppress_empty_list_ = suppress_empty_list;
  this->preserve_proto_field_names_ = preserve_proto_field_names;
  this->use_ints_for_enums_ = use_ints_for_enums;
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
  ::function(&this->field_scrub_callback_,field_scrub_callback);
  return;
}

Assistant:

DefaultValueObjectWriter::Node::Node(
    const std::string& name, const google::protobuf::Type* type, NodeKind kind,
    const DataPiece& data, bool is_placeholder,
    const std::vector<std::string>& path, bool suppress_empty_list,
    bool preserve_proto_field_names, bool use_ints_for_enums,
    FieldScrubCallBack field_scrub_callback)
    : name_(name),
      type_(type),
      kind_(kind),
      is_any_(false),
      data_(data),
      is_placeholder_(is_placeholder),
      path_(path),
      suppress_empty_list_(suppress_empty_list),
      preserve_proto_field_names_(preserve_proto_field_names),
      use_ints_for_enums_(use_ints_for_enums),
      field_scrub_callback_(std::move(field_scrub_callback)) {}